

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_tcbind_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint uVar1;
  
  uVar1 = (uint)((env->mvp->CP0_MVPControl & 2) == 0);
  (env->active_tc).CP0_TCBind =
       (uVar1 ^ 0x20001) & arg1 | (uVar1 | 0xfffdfffe) & (env->active_tc).CP0_TCBind;
  return;
}

Assistant:

void helper_mtc0_tcbind(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = (1 << CP0TCBd_TBE);
    uint32_t newval;

    if (env->mvp->CP0_MVPControl & (1 << CP0MVPCo_VPC)) {
        mask |= (1 << CP0TCBd_CurVPE);
    }
    newval = (env->active_tc.CP0_TCBind & ~mask) | (arg1 & mask);
    env->active_tc.CP0_TCBind = newval;
}